

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

void Curl_flush_cookies(Curl_easy *data,_Bool cleanup)

{
  CookieInfo *cookies;
  byte *newpath;
  curl_slist *list;
  bool bVar1;
  CURLcode CVar2;
  int iVar3;
  char *__filename;
  FILE *__stream;
  void *__base;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  Cookie *pCVar7;
  uint uVar8;
  ulong uVar9;
  size_t __nmemb;
  uchar local_39 [9];
  
  if ((data->set).str[5] == (char *)0x0) {
    if ((cleanup) && (list = (data->change).cookielist, list != (curl_slist *)0x0)) {
      curl_slist_free_all(list);
      (data->change).cookielist = (curl_slist *)0x0;
    }
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    goto LAB_0010f728;
  }
  if ((data->change).cookielist != (curl_slist *)0x0) {
    Curl_cookie_loadfiles(data);
  }
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  cookies = data->cookies;
  if (cookies == (CookieInfo *)0x0) goto LAB_0010f728;
  newpath = (byte *)(data->set).str[5];
  remove_expired(cookies);
  uVar8 = *newpath - 0x2d;
  if (uVar8 == 0) {
    uVar8 = (uint)newpath[1];
  }
  if (uVar8 == 0) {
    __filename = (char *)0x0;
    __stream = _stdout;
LAB_0010f583:
    fputs("# Netscape HTTP Cookie File\n# https://curl.haxx.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
          ,__stream);
    if (cookies->numcookies != 0) {
      __base = (*Curl_ccalloc)(1,cookies->numcookies << 3);
      if (__base == (void *)0x0) {
LAB_0010f6e6:
        if (__stream != (FILE *)0x0 && uVar8 != 0) {
          fclose(__stream);
        }
        goto LAB_0010f704;
      }
      lVar4 = 0;
      __nmemb = 0;
      do {
        for (pCVar7 = cookies->cookies[lVar4]; pCVar7 != (Cookie *)0x0; pCVar7 = pCVar7->next) {
          if (pCVar7->domain != (char *)0x0) {
            *(Cookie **)((long)__base + __nmemb * 8) = pCVar7;
            __nmemb = __nmemb + 1;
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x100);
      qsort(__base,__nmemb,8,cookie_sort_ct);
      if (__nmemb != 0) {
        uVar5 = 0;
        uVar9 = 1;
        do {
          pcVar6 = get_netscape_format(*(Cookie **)((long)__base + uVar5 * 8));
          if (pcVar6 == (char *)0x0) {
            curl_mfprintf((FILE *)__stream,"#\n# Fatal libcurl error\n");
            (*Curl_cfree)(__base);
            goto LAB_0010f6e6;
          }
          curl_mfprintf((FILE *)__stream,"%s\n",pcVar6);
          (*Curl_cfree)(pcVar6);
          bVar1 = uVar9 < __nmemb;
          uVar5 = uVar9;
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (bVar1);
      }
      (*Curl_cfree)(__base);
    }
    if (__stream != (FILE *)0x0 && uVar8 != 0) {
      fclose(__stream);
      iVar3 = Curl_rename(__filename,(char *)newpath);
      if (iVar3 != 0) {
        unlink(__filename);
        goto LAB_0010f704;
      }
    }
    (*Curl_cfree)(__filename);
  }
  else {
    CVar2 = Curl_rand_hex(data,local_39,9);
    if ((CVar2 == CURLE_OK) &&
       (__filename = curl_maprintf("%s.%s.tmp",newpath,local_39), __filename != (char *)0x0)) {
      __stream = fopen64(__filename,"w");
      if (__stream != (FILE *)0x0) goto LAB_0010f583;
LAB_0010f704:
      (*Curl_cfree)(__filename);
    }
    Curl_infof(data,"WARNING: failed to save cookies in %s\n",(data->set).str[5]);
  }
LAB_0010f728:
  if (cleanup) {
    if ((data->share == (Curl_share *)0x0) || (data->cookies != data->share->cookies)) {
      Curl_cookie_cleanup(data->cookies);
      data->cookies = (CookieInfo *)0x0;
    }
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return;
}

Assistant:

void Curl_flush_cookies(struct Curl_easy *data, bool cleanup)
{
  if(data->set.str[STRING_COOKIEJAR]) {
    if(data->change.cookielist) {
      /* If there is a list of cookie files to read, do it first so that
         we have all the told files read before we write the new jar.
         Curl_cookie_loadfiles() LOCKS and UNLOCKS the share itself! */
      Curl_cookie_loadfiles(data);
    }

    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);

    /* if we have a destination file for all the cookies to get dumped to */
    if(cookie_output(data, data->cookies, data->set.str[STRING_COOKIEJAR]))
      infof(data, "WARNING: failed to save cookies in %s\n",
            data->set.str[STRING_COOKIEJAR]);
  }
  else {
    if(cleanup && data->change.cookielist) {
      /* since nothing is written, we can just free the list of cookie file
         names */
      curl_slist_free_all(data->change.cookielist); /* clean up list */
      data->change.cookielist = NULL;
    }
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  }

  if(cleanup && (!data->share || (data->cookies != data->share->cookies))) {
    Curl_cookie_cleanup(data->cookies);
    data->cookies = NULL;
  }
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
}